

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O2

void juzzlin::StreamTest::testTimestampMode_none_shouldNotPrintTimestamp(string *message)

{
  ostream *poVar1;
  allocator<char> local_1b1;
  string local_1b0;
  stringstream ss;
  ostream local_180 [376];
  
  juzzlin::SimpleLogger::setTimestampMode(None);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  juzzlin::SimpleLogger::setStream(Info,local_180);
  juzzlin::SimpleLogger::setLoggingLevel(Info);
  juzzlin::SimpleLogger::SimpleLogger((SimpleLogger *)&local_1b0);
  poVar1 = (ostream *)juzzlin::SimpleLogger::info_abi_cxx11_();
  std::operator<<(poVar1,(string *)message);
  juzzlin::SimpleLogger::~SimpleLogger((SimpleLogger *)&local_1b0);
  assertString(&ss,message);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"##",&local_1b1);
  assertNotString(&ss,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void testTimestampMode_none_shouldNotPrintTimestamp(const std::string & message)
{
    L::setTimestampMode(L::TimestampMode::None);
    std::stringstream ss;
    L::setStream(L::Level::Info, ss);
    L::setLoggingLevel(L::Level::Info);
    L().info() << message;
    assertString(ss, message);
    assertNotString(ss, "##");
}